

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupChunk *pCVar1;
  CleanupChunk *pCVar2;
  ulong n;
  ulong uVar3;
  
  pCVar1 = this->cleanup_;
  do {
    if (pCVar1 == (CleanupChunk *)0x0) {
      uVar3 = 8;
    }
    else {
      uVar3 = pCVar1->size * 2;
      if (0x3f < uVar3) {
        uVar3 = 0x40;
      }
    }
    n = (ulong)((int)uVar3 * 0x10 + 0x17U & 0xff0);
    pCVar2 = (CleanupChunk *)this->ptr_;
    if ((ulong)((long)this->limit_ - (long)pCVar2) < n) {
      pCVar2 = (CleanupChunk *)AllocateAlignedFallback(this,n);
      pCVar1 = this->cleanup_;
    }
    else {
      this->ptr_ = (char *)((long)&((CleanupChunk *)(pCVar2->nodes + -1))->size + n);
    }
    pCVar2->next = pCVar1;
    pCVar2->size = uVar3;
    this->cleanup_ = pCVar2;
    this->cleanup_ptr_ = pCVar2->nodes;
    this->cleanup_limit_ = pCVar2->nodes + uVar3;
    pCVar1 = pCVar2;
  } while (uVar3 == 0);
  pCVar2->nodes[0].elem = elem;
  pCVar2->nodes[0].cleanup = cleanup;
  this->cleanup_ptr_ = (CleanupNode *)(pCVar2 + 1);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void SerialArena::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}